

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall minja::Parser::parseString_abi_cxx11_(Parser *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long in_RSI;
  char *pcVar4;
  anon_class_8_1_8991fb9c doParse;
  
  pcVar2 = *(char **)(in_RSI + 0x18);
  pcVar4 = *(char **)(in_RSI + 0x20);
  while ((pcVar4 != pcVar2 && (iVar3 = isspace((int)*pcVar4), iVar3 != 0))) {
    pcVar4 = pcVar4 + 1;
    *(char **)(in_RSI + 0x20) = pcVar4;
  }
  if ((*(char **)(in_RSI + 0x20) == pcVar2) ||
     ((cVar1 = **(char **)(in_RSI + 0x20), cVar1 != '\'' && (cVar1 != '\"')))) {
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  else {
    parseString[abi:cxx11]()::{lambda(char)#1}::operator()[abi_cxx11_
              ((_lambda_char__1_ *)this,-0x28);
  }
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::string> parseString() {
      auto doParse = [&](char quote) -> std::unique_ptr<std::string> {
        if (it == end || *it != quote) return nullptr;
        std::string result;
        bool escape = false;
        for (++it; it != end; ++it) {
          if (escape) {
            escape = false;
            switch (*it) {
              case 'n': result += '\n'; break;
              case 'r': result += '\r'; break;
              case 't': result += '\t'; break;
              case 'b': result += '\b'; break;
              case 'f': result += '\f'; break;
              case '\\': result += '\\'; break;
              default:
                if (*it == quote) {
                  result += quote;
                } else {
                  result += *it;
                }
                break;
            }
          } else if (*it == '\\') {
            escape = true;
          } else if (*it == quote) {
              ++it;
            return std::make_unique<std::string>(std::move(result));
          } else {
            result += *it;
          }
        }
        return nullptr;
      };

      consumeSpaces();
      if (it == end) return nullptr;
      if (*it == '"') return doParse('"');
      if (*it == '\'') return doParse('\'');
      return nullptr;
    }